

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O3

void sig_child_handler(void)

{
  int iVar1;
  ulong uVar2;
  logdir *ld;
  
  if (verbose != 0) {
    strerr_warn("svlogd: info: ","sigchild received.",(char *)0x0,(char *)0x0,(char *)0x0,
                (char *)0x0,(strerr *)0x0);
  }
  iVar1 = wait_nohang(&wstat);
  do {
    if (iVar1 < 1) {
      return;
    }
    ld = dir;
    for (uVar2 = (ulong)dirn; uVar2 != 0; uVar2 = uVar2 - 1) {
      if (ld->ppid == iVar1) {
        ld->ppid = 0;
        processorstop(ld);
        break;
      }
      ld = ld + 1;
    }
    iVar1 = wait_nohang(&wstat);
  } while( true );
}

Assistant:

void sig_child_handler(void) {
  int pid, l;

  if (verbose) strerr_warn2(INFO, "sigchild received.", 0);
  while ((pid =wait_nohang(&wstat)) > 0)
    for (l =0; l < dirn; ++l)
      if (dir[l].ppid == pid) {
        dir[l].ppid =0;
        processorstop(&dir[l]);
        break;
      }
}